

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneindex.cpp
# Opt level: O1

QList<QGraphicsItem_*> * __thiscall
QGraphicsSceneIndex::items
          (QList<QGraphicsItem_*> *__return_storage_ptr__,QGraphicsSceneIndex *this,
          QPolygonF *polygon,ItemSelectionMode mode,SortOrder order,QTransform *deviceTransform)

{
  QGraphicsSceneIndexPrivate *this_00;
  long *plVar1;
  ulong uVar2;
  QRectF exposeRect;
  undefined1 *puVar3;
  uint uVar4;
  ulong j;
  ulong i;
  long in_FS_OFFSET;
  QPainterPath path;
  undefined1 *local_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  QArrayData *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsSceneIndexPrivate **)(this + 8);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QGraphicsItem **)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_68 = -NAN;
  dStack_60 = -NAN;
  local_78 = -NAN;
  dStack_70 = -NAN;
  QPolygonF::boundingRect();
  if ((local_68 == 0.0) && (!NAN(local_68))) {
    local_78 = local_78 + -1e-05;
    dStack_70 = dStack_70 + 0.0;
    local_68 = local_68 + 2e-05;
    dStack_60 = dStack_60 + 0.0;
  }
  if ((dStack_60 == 0.0) && (!NAN(dStack_60))) {
    local_78 = local_78 + 0.0;
    dStack_70 = dStack_70 + -1e-05;
    local_68 = local_68 + 0.0;
    dStack_60 = dStack_60 + 2e-05;
  }
  local_80 = &DAT_aaaaaaaaaaaaaaaa;
  QPainterPath::QPainterPath((QPainterPath *)&local_80);
  QPainterPath::addPolygon((QPolygonF *)&local_80);
  plVar1 = *(long **)&this_00->field_0x8;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*plVar1 + 0x98))(&local_58,plVar1,&local_78,0);
  if (local_48 != (undefined1 *)0x0) {
    puVar3 = (undefined1 *)0x0;
    do {
      exposeRect.yp = dStack_70;
      exposeRect.xp = local_78;
      exposeRect.w = local_68;
      exposeRect.h = dStack_60;
      QGraphicsSceneIndexPrivate::recursive_items_helper
                (this_00,*(QGraphicsItem **)(puStack_50 + (long)puVar3 * 8),exposeRect,
                 QtPrivate::intersect_path,__return_storage_ptr__,deviceTransform,mode,1.0,&local_80
                );
      puVar3 = puVar3 + 1;
    } while (puVar3 < local_48);
  }
  if (order == DescendingOrder) {
    uVar2 = (__return_storage_ptr__->d).size;
    uVar4 = (uint)uVar2;
    if (1 < (int)uVar4) {
      j = (ulong)(uVar4 & 0x7fffffff);
      i = 0;
      do {
        j = j - 1;
        QList<QGraphicsItem_*>::swapItemsAt(__return_storage_ptr__,i,j);
        i = i + 1;
      } while (((uint)(uVar2 >> 1) & 0x3fffffff) != i);
    }
  }
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,8,0x10);
    }
  }
  QPainterPath::~QPainterPath((QPainterPath *)&local_80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QGraphicsItem *> QGraphicsSceneIndex::items(const QPolygonF &polygon, Qt::ItemSelectionMode mode,
                                                  Qt::SortOrder order, const QTransform &deviceTransform) const
{
    Q_D(const QGraphicsSceneIndex);
    QList<QGraphicsItem *> itemList;
    QRectF exposeRect = polygon.boundingRect();
    _q_adjustRect(&exposeRect);
    QPainterPath path;
    path.addPolygon(polygon);
    d->items_helper(exposeRect, &QtPrivate::intersect_path, &itemList, deviceTransform, mode, order, &path);
    return itemList;
}